

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CENamespace.cpp
# Opt level: O2

string * CppEphem::StrOpt::join<double>
                   (string *__return_storage_ptr__,vector<double,_std::allocator<double>_> *values,
                   char *delim)

{
  size_type sVar1;
  const_reference pvVar2;
  ostream *this;
  int i;
  ulong __n;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(values);
  if (sVar1 != 0) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](values,0);
    std::ostream::operator<<((ostream *)&ss,*pvVar2);
  }
  __n = 1;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(values);
    if (sVar1 <= __n) break;
    this = std::operator<<((ostream *)&ss,*delim);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](values,__n);
    std::ostream::operator<<(this,*pvVar2);
    __n = __n + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string CppEphem::StrOpt::join(const std::vector<T>& values,
                                   const char&           delim)
{
    // Assemble the first value in the string
    std::ostringstream ss;
    if (values.size() > 0) {
        ss << values[0];
    }

    // Now append the rest
    for (int i=1; i<values.size(); i++) { 
        ss << delim << values[i];
    }

    return ss.str();
}